

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

void log_secret(ptls_t *tls,char *type,ptls_iovec_t secret)

{
  _func_void_st_ptls_log_event_t_ptr_ptls_t_ptr_char_ptr_char_ptr_varargs *p_Var1;
  st_ptls_log_event_t *psVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  ptls_log_conn_state_t *conn;
  size_t l;
  char *pcVar5;
  char *value_;
  int ptlslog_include_appdata;
  ptls_log_conn_state_t *conn_state;
  ptls_t *_tls;
  char local_b8 [4];
  uint32_t active;
  char hexbuf [129];
  char *type_local;
  ptls_t *tls_local;
  ptls_iovec_t secret_local;
  
  uVar3 = ptls_log_point_maybe_active(&log_secret::logpoint);
  if (uVar3 != 0) {
    conn = ptls_get_log_state(tls);
    uVar4 = ptls_log_conn_maybe_active(conn,ptls_get_server_name,tls);
    if ((uVar4 & uVar3) != 0) {
      value_._4_4_ = 0;
      do {
        ptls_log__do_write_start(&log_secret::logpoint,1);
        ptls_log__do_push_element_unsigned64(",\"tls\":",7,(uint64_t)tls);
        l = strlen(type);
        ptls_log__do_push_element_safestr(",\"label\":",9,type,l);
        value_._4_4_ = ptls_log__do_write_end
                                 (&log_secret::logpoint,conn,ptls_get_server_name,tls,value_._4_4_);
      } while (value_._4_4_ != 0);
    }
  }
  if (tls->ctx->log_event != (ptls_log_event_t *)0x0) {
    p_Var1 = tls->ctx->log_event->cb;
    psVar2 = tls->ctx->log_event;
    pcVar5 = ptls_hexdump(local_b8,secret.base,secret.len);
    (*p_Var1)(psVar2,tls,type,"%s",pcVar5);
  }
  return;
}

Assistant:

static void log_secret(ptls_t *tls, const char *type, ptls_iovec_t secret)
{
    char hexbuf[PTLS_MAX_DIGEST_SIZE * 2 + 1];

    PTLS_PROBE(NEW_SECRET, tls, type, ptls_hexdump(hexbuf, secret.base, secret.len));
    PTLS_LOG_CONN(new_secret, tls, { PTLS_LOG_ELEMENT_SAFESTR(label, type); });

    if (tls->ctx->log_event != NULL)
        tls->ctx->log_event->cb(tls->ctx->log_event, tls, type, "%s", ptls_hexdump(hexbuf, secret.base, secret.len));
}